

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

bool __thiscall QMenuPrivate::mouseEventTaken(QMenuPrivate *this,QMouseEvent *e)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Type TVar9;
  MouseButton MVar10;
  MouseButtons MVar11;
  MouseEventSource MVar12;
  QWidget *pQVar13;
  QStyle *pQVar14;
  ulong uVar15;
  QMenuBar *pQVar16;
  QMenu *pQVar17;
  QPointingDevice *pQVar18;
  QEvent *in_RSI;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  QMenu *m;
  QMenuBar *mb;
  QWidget *next_widget;
  bool passOnEvent;
  QWidget *caused;
  int dir;
  bool isScroll;
  int fw;
  int vmargin;
  int hmargin;
  QStyle *style;
  QMenu *q;
  QMouseEvent new_e;
  QPointF cpos;
  QRect tearRect;
  QPoint pos;
  QStyleOption opt;
  int in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  QWidget *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  QMenuPrivate *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  QWidget *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  undefined1 activateFirst;
  undefined8 in_stack_fffffffffffffdd8;
  uint in_stack_fffffffffffffde0;
  QAction *in_stack_fffffffffffffe28;
  byte local_1c9;
  QWidget *local_1c8;
  uint local_1bc;
  bool local_181;
  QPointF local_180;
  QPointF local_170;
  QMouseEvent local_160 [80];
  QPoint local_110;
  QRect local_108;
  QPoint local_f8;
  QRect local_f0;
  QPointF local_e0;
  QPointF local_d0;
  QPointF local_c0;
  QPoint local_b0;
  QRect local_a8;
  QPointF local_98;
  QPoint local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  QPointF local_70;
  QPoint local_60;
  QPoint local_58;
  undefined1 local_50 [64];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar13 = &q_func(in_RDI)->super_QWidget;
  local_58 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_70 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x6449b3);
  local_60 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffda0);
  local_58 = QWidget::mapFromGlobal
                       (in_stack_fffffffffffffda0,
                        (QPoint *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  pQVar14 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88))
  ;
  memset(local_50,0xaa,0x40);
  QStyleOption::QStyleOption
            ((QStyleOption *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
             (int)((ulong)in_stack_fffffffffffffda0 >> 0x20),(int)in_stack_fffffffffffffda0);
  QStyleOption::initFrom
            ((QStyleOption *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
             in_stack_fffffffffffffda0);
  iVar2 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x1c,local_50,pQVar13);
  iVar3 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x1d,local_50,pQVar13);
  iVar4 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x1e,local_50,pQVar13);
  activateFirst = (undefined1)((ulong)in_stack_fffffffffffffdd0 >> 0x38);
  if (in_RDI->scroll != (QMenuScroller *)0x0) {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x644af9);
    activateFirst = (undefined1)((ulong)in_stack_fffffffffffffdd0 >> 0x38);
    if (!bVar1) {
      bVar1 = false;
      iVar5 = QPoint::x((QPoint *)0x644b16);
      activateFirst = (undefined1)((ulong)in_stack_fffffffffffffdd0 >> 0x38);
      if (-1 < iVar5) {
        iVar5 = QPoint::x((QPoint *)0x644b2c);
        iVar6 = QWidget::width((QWidget *)0x644b3d);
        activateFirst = (undefined1)((ulong)in_stack_fffffffffffffdd0 >> 0x38);
        if (iVar5 < iVar6) {
          for (local_1bc = 1; activateFirst = (undefined1)((ulong)in_stack_fffffffffffffdd0 >> 0x38)
              , (int)local_1bc < 3; local_1bc = local_1bc << 1) {
            if ((in_RDI->scroll->scrollFlags & local_1bc) != 0) {
              if (local_1bc == 1) {
                iVar5 = QPoint::y((QPoint *)0x644b9e);
                iVar6 = scrollerHeight((QMenuPrivate *)
                                       CONCAT44(in_stack_fffffffffffffd94,
                                                in_stack_fffffffffffffd90.i));
                bVar1 = iVar5 <= iVar6 + iVar4 + iVar3 +
                                 (int)(in_RDI->super_QWidgetPrivate).topmargin;
              }
              else if (local_1bc == 2) {
                iVar5 = QPoint::y((QPoint *)0x644bfb);
                iVar6 = QWidget::height((QWidget *)0x644c0c);
                iVar7 = scrollerHeight((QMenuPrivate *)
                                       CONCAT44(in_stack_fffffffffffffd94,
                                                in_stack_fffffffffffffd90.i));
                bVar1 = (((iVar6 - iVar7) - iVar4) - iVar3) -
                        (int)(in_RDI->super_QWidgetPrivate).bottommargin <= iVar5;
              }
              activateFirst = (undefined1)((ulong)in_stack_fffffffffffffdd0 >> 0x38);
              if (bVar1) {
                in_RDI->scroll->scrollDirection = (quint8)local_1bc;
                break;
              }
            }
          }
        }
      }
      if (bVar1) {
        QBasicTimer::start((QBasicTimer *)in_stack_fffffffffffffda0,in_stack_fffffffffffffdbc,
                           (QObject *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))
        ;
        local_181 = true;
        goto LAB_0064543e;
      }
      QBasicTimer::stop();
    }
  }
  if ((*(ushort *)&in_RDI->field_0x420 >> 9 & 1) != 0) {
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    iVar4 = (in_RDI->super_QWidgetPrivate).leftmargin + iVar2 + iVar4;
    QWidget::width((QWidget *)0x644d7f);
    pQVar14 = QWidget::style((QWidget *)
                             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x1f,local_50,pQVar13);
    QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 in_stack_fffffffffffffd94,in_stack_fffffffffffffd90.i,in_stack_fffffffffffffd8c,
                 in_stack_fffffffffffffd88);
    if ((in_RDI->scroll != (QMenuScroller *)0x0) && ((in_RDI->scroll->scrollFlags & 1) != 0)) {
      scrollerHeight((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90.i)
                    );
      QRect::translate((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90.i),
                       in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88);
    }
    QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                    (QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90.i));
    uVar8 = QRect::contains((QPoint *)&local_80,SUB81(&local_58,0));
    in_stack_fffffffffffffde0 = in_stack_fffffffffffffde0 & 0xffffff;
    if ((uVar8 & 1) != 0) {
      local_98 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x644e90);
      local_88 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffda0);
      bVar1 = hasMouseMoved((QMenuPrivate *)
                            CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                            (QPoint *)in_stack_fffffffffffffdb0);
      in_stack_fffffffffffffde0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffde0);
    }
    if ((char)(in_stack_fffffffffffffde0 >> 0x18) != '\0') {
      setCurrentAction((QMenuPrivate *)CONCAT44(iVar4,in_stack_fffffffffffffde0),
                       in_stack_fffffffffffffe28,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                       (SelectionReason)in_stack_fffffffffffffdd8,(bool)activateFirst);
      *(ushort *)&in_RDI->field_0x420 = *(ushort *)&in_RDI->field_0x420 & 0xf7ff | 0x800;
      TVar9 = QEvent::type(in_RSI);
      if (TVar9 == MouseButtonRelease) {
        bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QTornOffMenu> *)0x644f45);
        if (!bVar1) {
          pQVar17 = (QMenu *)operator_new(0x28);
          QTornOffMenu::QTornOffMenu
                    ((QTornOffMenu *)CONCAT44(iVar4,in_stack_fffffffffffffde0),pQVar17);
          QPointer<QTornOffMenu>::operator=
                    ((QPointer<QTornOffMenu> *)
                     CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90.i),
                     (QTornOffMenu *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
        }
        QPointer<QTornOffMenu>::operator->((QPointer<QTornOffMenu> *)0x644f95);
        QWidget::geometry(pQVar13);
        QWidget::setGeometry
                  (in_stack_fffffffffffffdc8,
                   (QRect *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
        QPointer<QTornOffMenu>::operator->((QPointer<QTornOffMenu> *)0x644fc8);
        QWidget::show(in_stack_fffffffffffffda0);
        hideUpToMenuBar(in_stack_fffffffffffffdb0);
      }
      local_181 = true;
      goto LAB_0064543e;
    }
    *(ushort *)&in_RDI->field_0x420 = *(ushort *)&in_RDI->field_0x420 & 0xf7ff;
  }
  local_a8 = QWidget::frameGeometry(in_stack_fffffffffffffdc8);
  local_c0 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x64503e);
  local_b0 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffda0);
  uVar15 = QRect::contains((QPoint *)&local_a8,SUB81(&local_b0,0));
  if ((uVar15 & 1) == 0) {
    local_1c8 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x6450ae);
    while (local_1c8 != (QWidget *)0x0) {
      local_1c9 = 0;
      pQVar13 = (QWidget *)0x0;
      local_d0.yp = -NAN;
      local_d0.xp = -NAN;
      local_e0 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x645111);
      local_d0 = QWidget::mapFromGlobal
                           ((QWidget *)in_stack_fffffffffffffdb0,
                            (QPointF *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8)
                           );
      pQVar16 = qobject_cast<QMenuBar*>((QObject *)0x645154);
      if (pQVar16 == (QMenuBar *)0x0) {
        pQVar17 = qobject_cast<QMenu*>((QObject *)0x6451cb);
        if (pQVar17 != (QMenu *)0x0) {
          local_108 = QWidget::rect((QWidget *)
                                    CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          local_110 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffda0);
          local_1c9 = QRect::contains((QPoint *)&local_108,SUB81(&local_110,0));
          local_1c9 = local_1c9 & 1;
          QMenu::d_func((QMenu *)0x64523d);
          pQVar13 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x64524c);
        }
      }
      else {
        local_f0 = QWidget::rect((QWidget *)
                                 CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
        local_f8 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffda0);
        local_1c9 = QRect::contains((QPoint *)&local_f0,SUB81(&local_f8,0));
        local_1c9 = local_1c9 & 1;
      }
      if ((local_1c9 != 0) &&
         ((TVar9 = QEvent::type(in_RSI), TVar9 != MouseButtonRelease ||
          (&mouseDown->super_QWidget == local_1c8)))) {
        memset(local_160,0xaa,0x50);
        TVar9 = QEvent::type(in_RSI);
        pQVar13 = local_1c8;
        QWidget::topLevelWidget((QWidget *)0x6452cd);
        local_170 = QWidget::mapTo((QWidget *)CONCAT44(TVar9,in_stack_fffffffffffffdb8),pQVar13,
                                   (QPointF *)
                                   CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
        local_180 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x645301);
        MVar10 = QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
        MVar11 = QSinglePointEvent::buttons
                           ((QSinglePointEvent *)
                            CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90.i));
        in_stack_fffffffffffffd90.i =
             (Int)QInputEvent::modifiers
                            ((QInputEvent *)
                             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90.i));
        MVar12 = QMouseEvent::source();
        pQVar18 = (QPointingDevice *)QPointerEvent::pointingDevice();
        QMouseEvent::QMouseEvent
                  (local_160,TVar9,(QPointF *)&local_d0,(QPointF *)&local_170,(QPointF *)&local_180,
                   MVar10,(QFlags_conflict1 *)
                          CONCAT44(in_stack_fffffffffffffd8c,
                                   MVar11.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                                   super_QFlagsStorage<Qt::MouseButton>.i),
                   (QFlags_conflict1 *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90.i),MVar12,pQVar18);
        QCoreApplication::sendEvent(&local_1c8->super_QObject,(QEvent *)local_160);
        local_181 = true;
        QMouseEvent::~QMouseEvent(local_160);
        goto LAB_0064543e;
      }
      local_1c8 = pQVar13;
      if (pQVar13 == (QWidget *)0x0) {
        QMenuSloppyState::leave
                  ((QMenuSloppyState *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90.i));
      }
    }
    local_181 = false;
  }
  else {
    local_181 = false;
  }
LAB_0064543e:
  QStyleOption::~QStyleOption
            ((QStyleOption *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90.i));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return local_181;
}

Assistant:

bool QMenuPrivate::mouseEventTaken(QMouseEvent *e)
{
    Q_Q(QMenu);
    QPoint pos = q->mapFromGlobal(e->globalPosition().toPoint());

    QStyle *style = q->style();
    QStyleOption opt(0);
    opt.initFrom(q);
    const int hmargin = style->pixelMetric(QStyle::PM_MenuHMargin, &opt, q);
    const int vmargin = style->pixelMetric(QStyle::PM_MenuVMargin, &opt, q);
    const int fw = style->pixelMetric(QStyle::PM_MenuPanelWidth, &opt, q);

    if (scroll && !activeMenu) { //let the scroller "steal" the event
        bool isScroll = false;
        if (pos.x() >= 0 && pos.x() < q->width()) {
        for (int dir = QMenuScroller::ScrollUp; dir <= QMenuScroller::ScrollDown; dir = dir << 1) {
                if (scroll->scrollFlags & dir) {
                    if (dir == QMenuScroller::ScrollUp)
                        isScroll = (pos.y() <= scrollerHeight() + fw + vmargin + topmargin);
                    else if (dir == QMenuScroller::ScrollDown)
                        isScroll = (pos.y() >= q->height() - scrollerHeight() - fw - vmargin - bottommargin);
                    if (isScroll) {
                        scroll->scrollDirection = dir;
                        break;
                    }
                }
            }
        }
        if (isScroll) {
            scroll->scrollTimer.start(50, q);
            return true;
        } else {
            scroll->scrollTimer.stop();
        }
    }

    if (tearoff) { //let the tear off thingie "steal" the event..
        QRect tearRect(leftmargin + hmargin + fw, topmargin + vmargin + fw, q->width() - fw * 2 - hmargin * 2 -leftmargin - rightmargin,
                       q->style()->pixelMetric(QStyle::PM_MenuTearoffHeight, &opt, q));
        if (scroll && scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
            tearRect.translate(0, scrollerHeight());
        q->update(tearRect);
        if (tearRect.contains(pos) && hasMouseMoved(e->globalPosition().toPoint())) {
            setCurrentAction(nullptr);
            tearoffHighlighted = 1;
            if (e->type() == QEvent::MouseButtonRelease) {
                if (!tornPopup)
                    tornPopup = new QTornOffMenu(q);
                tornPopup->setGeometry(q->geometry());
                tornPopup->show();
                hideUpToMenuBar();
            }
            return true;
        }
        tearoffHighlighted = 0;
    }

    if (q->frameGeometry().contains(e->globalPosition().toPoint()))
        return false; //otherwise if the event is in our rect we want it..

    for(QWidget *caused = causedPopup.widget; caused;) {
        bool passOnEvent = false;
        QWidget *next_widget = nullptr;
        QPointF cpos = caused->mapFromGlobal(e->globalPosition());
#if QT_CONFIG(menubar)
        if (QMenuBar *mb = qobject_cast<QMenuBar*>(caused)) {
            passOnEvent = mb->rect().contains(cpos.toPoint());
        } else
#endif
        if (QMenu *m = qobject_cast<QMenu*>(caused)) {
            passOnEvent = m->rect().contains(cpos.toPoint());
            next_widget = m->d_func()->causedPopup.widget;
        }
        if (passOnEvent) {
            if (e->type() != QEvent::MouseButtonRelease || mouseDown == caused) {
                QMouseEvent new_e(e->type(), cpos, caused->mapTo(caused->topLevelWidget(), cpos), e->globalPosition(),
                                  e->button(), e->buttons(), e->modifiers(),
                                  e->source(), e->pointingDevice());
                QCoreApplication::sendEvent(caused, &new_e);
                return true;
            }
        }
        caused = next_widget;
        if (!caused)
            sloppyState.leave(); // Start timers
    }
    return false;
}